

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O2

ssize_t __thiscall PackageList::write(PackageList *this,int __fd,void *__buf,size_t __n)

{
  _Base_ptr p_Var1;
  Value *pVVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  _Base_ptr p_Var5;
  undefined1 local_2e8 [32];
  Value root;
  StyledWriter writer;
  ofstream fout;
  
  Json::Value::Value(&root,nullValue);
  for (p_Var3 = (this->packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->packages)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    Json::Value::Value((Value *)&fout,nullValue);
    Json::Value::Value((Value *)&writer,(String *)(p_Var3 + 3));
    pVVar2 = Json::Value::operator[]((Value *)&fout,"version");
    Json::Value::operator=(pVVar2,(Value *)&writer);
    Json::Value::~Value((Value *)&writer);
    p_Var1 = p_Var3[4]._M_parent;
    for (p_Var5 = *(_Base_ptr *)(p_Var3 + 4); p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
      pVVar2 = Json::Value::operator[]((Value *)&fout,"include");
      Json::Value::Value((Value *)&writer,(String *)p_Var5);
      Json::Value::append(pVVar2,(Value *)&writer);
      Json::Value::~Value((Value *)&writer);
    }
    p_Var1 = *(_Base_ptr *)(p_Var3 + 5);
    for (p_Var5 = p_Var3[4]._M_right; p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
      pVVar2 = Json::Value::operator[]((Value *)&fout,"lib");
      Json::Value::Value((Value *)&writer,(String *)p_Var5);
      Json::Value::append(pVVar2,(Value *)&writer);
      Json::Value::~Value((Value *)&writer);
    }
    p_Var1 = p_Var3[5]._M_right;
    for (p_Var5 = p_Var3[5]._M_left; p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
      pVVar2 = Json::Value::operator[]((Value *)&fout,"dll");
      Json::Value::Value((Value *)&writer,(String *)p_Var5);
      Json::Value::append(pVVar2,(Value *)&writer);
      Json::Value::~Value((Value *)&writer);
    }
    pVVar2 = Json::Value::operator[](&root,(String *)(p_Var3 + 2));
    Json::Value::operator=(pVVar2,(Value *)&fout);
    Json::Value::~Value((Value *)&fout);
  }
  Json::StyledWriter::StyledWriter(&writer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT44(in_register_00000034,__fd) + 0xa0),"cip_list.json");
  std::ofstream::ofstream(&fout,(string *)local_2e8,_S_out);
  std::__cxx11::string::~string((string *)local_2e8);
  Json::StyledWriter::write_abi_cxx11_((StyledWriter *)local_2e8,(int)&writer,&root,__n);
  poVar4 = std::operator<<((ostream *)&fout,(string *)local_2e8);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)local_2e8);
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  Json::StyledWriter::~StyledWriter(&writer);
  Json::Value::~Value(&root);
  return extraout_RAX;
}

Assistant:

void write(CCDir dir){
        Json::Value root;
        for(auto&p:packages){
            Json::Value item;
            item["version"]=p.second.version;
            for(auto&e:p.second.include_files){
                item["include"].append(e);
            }
            for(auto&e:p.second.lib_files){
                item["lib"].append(e);
            }
            for(auto&e:p.second.dll_files){
                item["dll"].append(e);
            }
            root[p.second.name]=item;
        }
        Json::StyledWriter writer;
        std::ofstream fout(dir.compiler_path+"cip_list.json",std::ios::out);
        fout << writer.write(root) << std::endl;
        fout.close();
	}